

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_udunits.cpp
# Opt level: O0

void __thiscall UDUNITS_acceptedAlias_Test::TestBody(UDUNITS_acceptedAlias_Test *this)

{
  undefined8 uVar1;
  bool bVar2;
  Message *pMVar3;
  char *pcVar4;
  XMLElement *pXVar5;
  XMLNode *pXVar6;
  uint64_t uVar7;
  XMLElement *this_00;
  ostream *poVar8;
  char *in_R9;
  precise_unit pVar9;
  AssertHelper local_518;
  Message local_510;
  int local_504;
  undefined1 local_500 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  unit local_4c4;
  unit local_4bc;
  allocator local_4b1;
  string local_4b0;
  undefined1 local_490 [8];
  precise_unit symUnit;
  char *symString;
  XMLElement *sym;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  unit local_444;
  unit local_43c;
  allocator local_431;
  string local_430;
  undefined1 local_410 [8];
  precise_unit nameUnit;
  char *sname;
  XMLElement *name;
  XMLElement *alias;
  undefined1 local_3c8 [8];
  precise_unit definitionUnit;
  string local_3b0 [8];
  string def;
  XMLElement *pXStack_388;
  int failConvert;
  XMLElement *cs;
  string local_378;
  AssertHelper local_358;
  Message local_350;
  bool local_341;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_;
  XMLError local_31c;
  undefined1 local_318 [4];
  XMLError err;
  XMLDocument doc;
  UDUNITS_acceptedAlias_Test *this_local;
  
  doc._commentPool._120_8_ = this;
  tinyxml2::XMLDocument::XMLDocument((XMLDocument *)local_318,true,PRESERVE_WHITESPACE);
  local_31c = tinyxml2::XMLDocument::LoadFile
                        ((XMLDocument *)local_318,
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/UDUNITS2/udunits2-accepted.xml"
                        );
  local_341 = local_31c == XML_SUCCESS;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_340,&local_341,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar2) {
    testing::Message::Message(&local_350);
    pMVar3 = testing::Message::operator<<(&local_350,&local_31c);
    pMVar3 = testing::Message::operator<<(pMVar3,std::endl<char,std::char_traits<char>>);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_378,(internal *)local_340,(AssertionResult *)0x1d3e4c,"true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
               ,0x4f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_358,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    std::__cxx11::string::~string((string *)&local_378);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  if (bVar2) {
    pXVar5 = tinyxml2::XMLNode::FirstChildElement((XMLNode *)local_318,"unit-system");
    pXStack_388 = tinyxml2::XMLNode::FirstChildElement(&pXVar5->super_XMLNode,"unit");
    def.field_2._12_4_ = 0;
    while (pXStack_388 != (XMLElement *)0x0) {
      pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXStack_388->super_XMLNode,"def");
      pXVar6 = tinyxml2::XMLNode::FirstChild(&pXVar5->super_XMLNode);
      pcVar4 = tinyxml2::XMLNode::Value(pXVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3b0,pcVar4,(allocator *)((long)&definitionUnit.commodity_ + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&definitionUnit.commodity_ + 3));
      std::__cxx11::string::string((string *)&alias,local_3b0);
      uVar7 = units::getDefaultFlags();
      pVar9 = units::unit_from_string((string *)&alias,uVar7);
      definitionUnit.multiplier_ = pVar9._8_8_;
      local_3c8 = (undefined1  [8])pVar9.multiplier_;
      std::__cxx11::string::~string((string *)&alias);
      pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXStack_388->super_XMLNode,"aliases");
      if (pXVar5 == (XMLElement *)0x0) {
        pXStack_388 = tinyxml2::XMLNode::NextSiblingElement(&pXStack_388->super_XMLNode,"unit");
      }
      else {
        for (sname = (char *)tinyxml2::XMLNode::FirstChildElement(&pXVar5->super_XMLNode,"name");
            sname != (char *)0x0;
            sname = (char *)tinyxml2::XMLNode::NextSiblingElement((XMLNode *)sname,"name")) {
          this_00 = tinyxml2::XMLNode::FirstChildElement((XMLNode *)sname,"singular");
          pXVar6 = tinyxml2::XMLNode::FirstChild(&this_00->super_XMLNode);
          pcVar4 = tinyxml2::XMLNode::Value(pXVar6);
          nameUnit._8_8_ = pcVar4;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_430,pcVar4,&local_431);
          uVar7 = units::getDefaultFlags();
          pVar9 = units::unit_from_string(&local_430,uVar7);
          nameUnit.multiplier_ = pVar9._8_8_;
          local_410 = (undefined1  [8])pVar9.multiplier_;
          std::__cxx11::string::~string((string *)&local_430);
          std::allocator<char>::~allocator((allocator<char> *)&local_431);
          bVar2 = units::is_error((precise_unit *)local_410);
          if (bVar2) {
            poVar8 = std::operator<<((ostream *)&std::cout,"unable to convert ");
            poVar8 = std::operator<<(poVar8,(char *)nameUnit._8_8_);
            poVar8 = std::operator<<(poVar8," into a valid unit def=");
            poVar8 = std::operator<<(poVar8,local_3b0);
            std::operator<<(poVar8,'\n');
            def.field_2._12_4_ = def.field_2._12_4_ + 1;
          }
          else {
            local_43c = units::unit_cast((precise_unit *)local_410);
            local_444 = units::unit_cast((precise_unit *)local_3c8);
            bVar2 = units::unit::operator!=(&local_43c,&local_444);
            uVar1 = nameUnit._8_8_;
            if (bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_468,(char *)uVar1,(allocator *)((long)&sym + 7));
              bVar2 = std::operator!=(&local_468,"gal");
              std::__cxx11::string::~string((string *)&local_468);
              std::allocator<char>::~allocator((allocator<char> *)((long)&sym + 7));
              if (bVar2) {
                poVar8 = std::operator<<((ostream *)&std::cout,"name and unit do not match ");
                poVar8 = std::operator<<(poVar8,(char *)nameUnit._8_8_);
                poVar8 = std::operator<<(poVar8," and ");
                poVar8 = std::operator<<(poVar8,local_3b0);
                std::operator<<(poVar8,"\n");
                def.field_2._12_4_ = def.field_2._12_4_ + 1;
              }
            }
          }
        }
        for (symString = (char *)tinyxml2::XMLNode::FirstChildElement
                                           (&pXVar5->super_XMLNode,"symbol");
            symString != (char *)0x0;
            symString = (char *)tinyxml2::XMLNode::NextSiblingElement((XMLNode *)symString,"symbol")
            ) {
          pXVar6 = tinyxml2::XMLNode::FirstChild((XMLNode *)symString);
          pcVar4 = tinyxml2::XMLNode::Value(pXVar6);
          symUnit._8_8_ = pcVar4;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_4b0,pcVar4,&local_4b1);
          uVar7 = units::getDefaultFlags();
          pVar9 = units::unit_from_string(&local_4b0,uVar7);
          symUnit.multiplier_ = pVar9._8_8_;
          local_490 = (undefined1  [8])pVar9.multiplier_;
          std::__cxx11::string::~string((string *)&local_4b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
          bVar2 = units::is_error((precise_unit *)local_490);
          if (bVar2) {
            poVar8 = std::operator<<((ostream *)&std::cout,"unable to convert ");
            poVar8 = std::operator<<(poVar8,(char *)symUnit._8_8_);
            poVar8 = std::operator<<(poVar8," into a valid unit def=");
            poVar8 = std::operator<<(poVar8,local_3b0);
            std::operator<<(poVar8,'\n');
            def.field_2._12_4_ = def.field_2._12_4_ + 1;
          }
          else {
            local_4bc = units::unit_cast((precise_unit *)local_490);
            local_4c4 = units::unit_cast((precise_unit *)local_3c8);
            bVar2 = units::unit::operator!=(&local_4bc,&local_4c4);
            uVar1 = symUnit._8_8_;
            if (bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_4e8,(char *)uVar1,
                         (allocator *)
                         ((long)&gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7));
              bVar2 = std::operator!=(&local_4e8,"a");
              std::__cxx11::string::~string((string *)&local_4e8);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7));
              if (bVar2) {
                poVar8 = std::operator<<((ostream *)&std::cout,"name and unit do not match ");
                poVar8 = std::operator<<(poVar8,(char *)symUnit._8_8_);
                poVar8 = std::operator<<(poVar8," and ");
                poVar8 = std::operator<<(poVar8,local_3b0);
                std::operator<<(poVar8,"\n");
                def.field_2._12_4_ = def.field_2._12_4_ + 1;
              }
            }
          }
        }
        pXStack_388 = tinyxml2::XMLNode::NextSiblingElement(&pXStack_388->super_XMLNode,"unit");
      }
      std::__cxx11::string::~string(local_3b0);
    }
    local_504 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_500,"failConvert","0",(int *)(def.field_2._M_local_buf + 0xc),
               &local_504);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
    if (!bVar2) {
      testing::Message::Message(&local_510);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
      testing::internal::AssertHelper::AssertHelper
                (&local_518,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
                 ,0x87,pcVar4);
      testing::internal::AssertHelper::operator=(&local_518,&local_510);
      testing::internal::AssertHelper::~AssertHelper(&local_518);
      testing::Message::~Message(&local_510);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  }
  tinyxml2::XMLDocument::~XMLDocument((XMLDocument *)local_318);
  return;
}

Assistant:

TEST(UDUNITS, acceptedAlias)
{
    tinyxml2::XMLDocument doc;
    auto err = doc.LoadFile(TEST_FILE_FOLDER "/UDUNITS2/udunits2-accepted.xml");
    ASSERT_FALSE(err) << err << std::endl;
    auto cs = doc.FirstChildElement("unit-system")->FirstChildElement("unit");
    int failConvert{0};
    while (cs != nullptr) {
        std::string def = cs->FirstChildElement("def")->FirstChild()->Value();

        auto definitionUnit = units::unit_from_string(def);

        auto alias = cs->FirstChildElement("aliases");
        if (!alias) {
            cs = cs->NextSiblingElement("unit");
            continue;
        }
        auto name = alias->FirstChildElement("name");
        while (name != nullptr) {
            auto sname =
                name->FirstChildElement("singular")->FirstChild()->Value();
            auto nameUnit = units::unit_from_string(sname);
            if (is_error(nameUnit)) {
                std::cout << "unable to convert " << sname
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (unit_cast(nameUnit) != unit_cast(definitionUnit)) {
                    if (std::string(sname) != "gal") {
                        std::cout << "name and unit do not match " << sname
                                  << " and " << def << "\n";
                        ++failConvert;
                    }
                }
            }
            name = name->NextSiblingElement("name");
        }
        // check for symbols
        auto sym = alias->FirstChildElement("symbol");
        while (sym != nullptr) {
            auto symString = sym->FirstChild()->Value();
            auto symUnit = units::unit_from_string(symString);
            if (is_error(symUnit)) {
                std::cout << "unable to convert " << symString
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (unit_cast(symUnit) != unit_cast(definitionUnit)) {
                    if (std::string(symString) != "a") {
                        std::cout << "name and unit do not match " << symString
                                  << " and " << def << "\n";
                        ++failConvert;
                    }
                }
            }
            sym = sym->NextSiblingElement("symbol");
        }

        cs = cs->NextSiblingElement("unit");
    }
    EXPECT_EQ(failConvert, 0);
}